

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_job_queue_get_heap_size(ma_job_queue_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  ma_job_queue_heap_layout layout;
  ma_job_queue_heap_layout local_20;
  
  if (pHeapSizeInBytes != (size_t *)0x0) {
    *pHeapSizeInBytes = 0;
    mVar1 = ma_job_queue_get_heap_layout(pConfig,&local_20);
    if (mVar1 == MA_SUCCESS) {
      *pHeapSizeInBytes = local_20.sizeInBytes;
      mVar1 = MA_SUCCESS;
    }
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_job_queue_get_heap_size(const ma_job_queue_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_job_queue_heap_layout layout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_job_queue_get_heap_layout(pConfig, &layout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = layout.sizeInBytes;

    return MA_SUCCESS;
}